

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O2

int __thiscall QTcpServer::listen(QTcpServer *this,int __fd,int __n)

{
  QHostAddress *address;
  QHostAddressPrivate *pQVar1;
  char cVar2;
  quint16 qVar3;
  NetworkLayerProtocol NVar4;
  NetworkLayerProtocol NVar5;
  SocketError SVar6;
  QHostAddressPrivate *pQVar7;
  undefined4 in_register_00000034;
  int iVar8;
  long in_FS_OFFSET;
  QNetworkProxy proxy;
  QHostAddress addr;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  address = *(QHostAddress **)&this->field_0x8;
  if (*(int *)((long)&address[0x15].d.d.ptr + 4) == 5) {
    local_58.d._0_4_ = 2;
    local_58.size._4_4_ = 0;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_40 = "default";
    iVar8 = 0;
    QMessageLogger::warning((char *)&local_58,"QTcpServer::listen() called when already listening");
    goto LAB_001ba5cf;
  }
  NVar4 = QHostAddress::protocol((QHostAddress *)CONCAT44(in_register_00000034,__fd));
  addr.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&addr,(QHostAddress *)CONCAT44(in_register_00000034,__fd));
  proxy.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QTcpServerPrivate::resolveProxy((QTcpServerPrivate *)&proxy,address,(quint16)&addr);
  pQVar7 = address[0x16].d.d.ptr;
  if (pQVar7 != (QHostAddressPrivate *)0x0) {
    (**(code **)(*(long *)pQVar7 + 0x20))();
  }
  pQVar7 = (QHostAddressPrivate *)
           QAbstractSocketEngine::createSocketEngine
                     (*(SocketType *)&address[0x15].d.d.ptr,&proxy,&this->super_QObject);
  address[0x16].d.d.ptr = pQVar7;
  if (pQVar7 == (QHostAddressPrivate *)0x0) {
    *(undefined4 *)&address[0x17].d.d.ptr = 10;
    iVar8 = 0;
    tr((QString *)&local_58,"Operation on socket is not supported",(char *)0x0,-1);
    pQVar7 = address[0x18].d.d.ptr;
    pQVar1 = address[0x19].d.d.ptr;
    address[0x18].d.d.ptr = (QHostAddressPrivate *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
    address[0x19].d.d.ptr = (QHostAddressPrivate *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    local_58.d._0_4_ = SUB84(pQVar7,0);
    local_58.d._4_4_ = (undefined4)((ulong)pQVar7 >> 0x20);
    local_58.ptr._0_4_ = SUB84(pQVar1,0);
    local_58.ptr._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
    pQVar7 = address[0x1a].d.d.ptr;
    address[0x1a].d.d.ptr =
         (QHostAddressPrivate *)CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
    local_58.size._0_4_ = SUB84(pQVar7,0);
    local_58.size._4_4_ = (undefined4)((ulong)pQVar7 >> 0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  else {
    cVar2 = (**(code **)(*(long *)pQVar7 + 0x60))
                      (pQVar7,*(undefined4 *)&address[0x15].d.d.ptr,NVar4);
    pQVar7 = address[0x16].d.d.ptr;
    if (cVar2 != '\0') {
      NVar5 = QAbstractSocketEngine::protocol((QAbstractSocketEngine *)pQVar7);
      NVar4 = QHostAddress::protocol(&addr);
      if (NVar4 == AnyIPProtocol && NVar5 == IPv4Protocol) {
        QHostAddress::operator=(&addr,AnyIPv4);
      }
      (*(code *)(((address->d).d.ptr)->field_1).a6_64.c[0])(address);
      pQVar7 = address[0x16].d.d.ptr;
      cVar2 = (**(code **)(*(long *)pQVar7 + 0x90))(pQVar7,&addr,__n & 0xffff);
      pQVar7 = address[0x16].d.d.ptr;
      if (cVar2 != '\0') {
        cVar2 = (**(code **)(*(long *)pQVar7 + 0x98))(pQVar7,*(undefined4 *)&address[0x1b].d.d.ptr);
        pQVar7 = address[0x16].d.d.ptr;
        if (cVar2 != '\0') {
          QAbstractSocketEngine::setReceiver
                    ((QAbstractSocketEngine *)pQVar7,
                     (QAbstractSocketEngineReceiver *)(address + 0xf));
          pQVar7 = address[0x16].d.d.ptr;
          (**(code **)(*(long *)pQVar7 + 0x140))(pQVar7,1);
          *(undefined4 *)((long)&address[0x15].d.d.ptr + 4) = 5;
          QAbstractSocketEngine::localAddress((QAbstractSocketEngine *)&local_58);
          pQVar7 = address[0x14].d.d.ptr;
          address[0x14].d.d.ptr = (QHostAddressPrivate *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_)
          ;
          local_58.d._0_4_ = SUB84(pQVar7,0);
          local_58.d._4_4_ = (undefined4)((ulong)pQVar7 >> 0x20);
          QHostAddress::~QHostAddress((QHostAddress *)&local_58);
          qVar3 = QAbstractSocketEngine::localPort((QAbstractSocketEngine *)address[0x16].d.d.ptr);
          *(quint16 *)&address[0x13].d.d.ptr = qVar3;
          iVar8 = (int)CONCAT71((int7)((ulong)&local_58 >> 8),1);
          goto LAB_001ba5bb;
        }
      }
    }
    SVar6 = QAbstractSocketEngine::error((QAbstractSocketEngine *)pQVar7);
    *(SocketError *)&address[0x17].d.d.ptr = SVar6;
    QAbstractSocketEngine::errorString
              ((QString *)&local_58,(QAbstractSocketEngine *)address[0x16].d.d.ptr);
    pQVar7 = address[0x18].d.d.ptr;
    pQVar1 = address[0x19].d.d.ptr;
    address[0x18].d.d.ptr = (QHostAddressPrivate *)CONCAT44(local_58.d._4_4_,local_58.d._0_4_);
    address[0x19].d.d.ptr = (QHostAddressPrivate *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    local_58.d._0_4_ = SUB84(pQVar7,0);
    local_58.d._4_4_ = (undefined4)((ulong)pQVar7 >> 0x20);
    local_58.ptr._0_4_ = SUB84(pQVar1,0);
    local_58.ptr._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
    pQVar7 = address[0x1a].d.d.ptr;
    address[0x1a].d.d.ptr =
         (QHostAddressPrivate *)CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
    local_58.size._0_4_ = SUB84(pQVar7,0);
    local_58.size._4_4_ = (undefined4)((ulong)pQVar7 >> 0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    iVar8 = 0;
  }
LAB_001ba5bb:
  QNetworkProxy::~QNetworkProxy(&proxy);
  QHostAddress::~QHostAddress(&addr);
LAB_001ba5cf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QTcpServer::listen(const QHostAddress &address, quint16 port)
{
    Q_D(QTcpServer);
    if (d->state == QAbstractSocket::ListeningState) {
        qWarning("QTcpServer::listen() called when already listening");
        return false;
    }

    QAbstractSocket::NetworkLayerProtocol proto = address.protocol();
    QHostAddress addr = address;

#ifdef QT_NO_NETWORKPROXY
    static const QNetworkProxy &proxy = *(QNetworkProxy *)0;
#else
    QNetworkProxy proxy = d->resolveProxy(addr, port);
#endif

    delete d->socketEngine;
    d->socketEngine = QAbstractSocketEngine::createSocketEngine(d->socketType, proxy, this);
    if (!d->socketEngine) {
        d->serverSocketError = QAbstractSocket::UnsupportedSocketOperationError;
        d->serverSocketErrorString = tr("Operation on socket is not supported");
        return false;
    }
    if (!d->socketEngine->initialize(d->socketType, proto)) {
        d->serverSocketError = d->socketEngine->error();
        d->serverSocketErrorString = d->socketEngine->errorString();
        return false;
    }
    proto = d->socketEngine->protocol();
    if (addr.protocol() == QAbstractSocket::AnyIPProtocol && proto == QAbstractSocket::IPv4Protocol)
        addr = QHostAddress::AnyIPv4;

    d->configureCreatedSocket();

    if (!d->socketEngine->bind(addr, port)) {
        d->serverSocketError = d->socketEngine->error();
        d->serverSocketErrorString = d->socketEngine->errorString();
        return false;
    }

    if (!d->socketEngine->listen(d->listenBacklog)) {
        d->serverSocketError = d->socketEngine->error();
        d->serverSocketErrorString = d->socketEngine->errorString();
        return false;
    }

    d->socketEngine->setReceiver(d);
    d->socketEngine->setReadNotificationEnabled(true);

    d->state = QAbstractSocket::ListeningState;
    d->address = d->socketEngine->localAddress();
    d->port = d->socketEngine->localPort();

#if defined (QTCPSERVER_DEBUG)
    qDebug("QTcpServer::listen(%i, \"%s\") == true (listening on port %i)", port,
           address.toString().toLatin1().constData(), d->socketEngine->localPort());
#endif
    return true;
}